

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

void __thiscall ear::Triplet::Triplet(Triplet *this,Vector3i *outputChannels,Matrix3d *positions)

{
  XprTypeNested local_60 [3];
  MatrixXd local_48;
  VectorXi local_30;
  Matrix3d *local_20;
  Matrix3d *positions_local;
  Vector3i *outputChannels_local;
  Triplet *this_local;
  
  local_20 = positions;
  positions_local = (Matrix3d *)outputChannels;
  outputChannels_local = (Vector3i *)this;
  Eigen::Matrix<int,-1,1,0,-1,1>::Matrix<Eigen::Matrix<int,3,1,0,3,1>>
            ((Matrix<int,_1,1,0,_1,1> *)&local_30,
             (EigenBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)outputChannels);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,3,3,0,3,3>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_48,
             (EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)positions);
  RegionHandler::RegionHandler(&this->super_RegionHandler,&local_30,&local_48);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_48);
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix(&local_30);
  (this->super_RegionHandler)._vptr_RegionHandler = (_func_int **)&PTR_handle_003d7550;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix(&this->_basis);
  local_60[0] = (XprTypeNested)
                Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::inverse
                          ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                           &(this->super_RegionHandler)._positions);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)&this->_basis,
             (DenseBase<Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)local_60);
  return;
}

Assistant:

Triplet::Triplet(Eigen::Vector3i outputChannels, Eigen::Matrix3d positions)
      : RegionHandler(outputChannels, positions) {
    _basis = _positions.inverse();
  }